

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRenode.c
# Opt level: O0

int Abc_NtkRenodeEvalAig(If_Man_t *p,If_Cut_t *pCut)

{
  int iVar1;
  char *pcVar2;
  uint *pTruth;
  Kit_Graph_t *pGraph_00;
  Kit_Node_t *pNode;
  Kit_Node_t *pLeaf;
  int local_34;
  int nNodes;
  int i;
  Kit_Graph_t *pGraph;
  char *pPerm;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  pcVar2 = If_CutPerm(pCut);
  pTruth = If_CutTruth(p,pCut);
  iVar1 = If_CutLeaveNum(pCut);
  pGraph_00 = Kit_TruthToGraph(pTruth,iVar1,s_vMemory);
  if (pGraph_00 == (Kit_Graph_t *)0x0) {
    local_34 = 0;
    while( true ) {
      iVar1 = If_CutLeaveNum(pCut);
      if (iVar1 <= local_34) break;
      pcVar2[local_34] = 'd';
      local_34 = local_34 + 1;
    }
    p_local._4_4_ = 0xfff;
  }
  else {
    p_local._4_4_ = Kit_GraphNodeNum(pGraph_00);
    local_34 = 0;
    while( true ) {
      iVar1 = If_CutLeaveNum(pCut);
      if (iVar1 <= local_34) break;
      pNode = Kit_GraphNodeLast(pGraph_00);
      pLeaf = Kit_GraphNode(pGraph_00,local_34);
      iVar1 = Kit_GraphLeafDepth_rec(pGraph_00,pNode,pLeaf);
      pcVar2[local_34] = (char)iVar1;
      local_34 = local_34 + 1;
    }
    Kit_GraphFree(pGraph_00);
  }
  return p_local._4_4_;
}

Assistant:

int Abc_NtkRenodeEvalAig( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    Kit_Graph_t * pGraph;
    int i, nNodes;
    pGraph = Kit_TruthToGraph( If_CutTruth(p, pCut), If_CutLeaveNum(pCut), s_vMemory );
    if ( pGraph == NULL )
    {
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
            pPerm[i] = 100;
        return IF_COST_MAX;
    }
    nNodes = Kit_GraphNodeNum( pGraph );
    for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        pPerm[i] = Kit_GraphLeafDepth_rec( pGraph, Kit_GraphNodeLast(pGraph), Kit_GraphNode(pGraph, i) );
    Kit_GraphFree( pGraph );
    return nNodes;
}